

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray * __thiscall
QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,QStringBuilder<QByteArray,_QByteArray> *this)

{
  char *__dest;
  size_t __n;
  size_t __n_00;
  char *pcVar1;
  
  if ((this->b).d.ptr == (char *)0x0 && (this->a).d.ptr == (char *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pcVar1 = (char *)((this->b).d.size + (this->a).d.size);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(__return_storage_ptr__,(longlong)pcVar1,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    __n = (this->a).d.size;
    if (__n != 0) {
      memcpy(__dest,(this->a).d.ptr,__n);
    }
    __n_00 = (this->b).d.size;
    if (__n_00 != 0) {
      memcpy(__dest + __n,(this->b).d.ptr,__n_00);
    }
    if (pcVar1 != __dest + __n + (__n_00 - (long)__dest)) {
      QByteArray::resize((longlong)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }